

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_ActiveSound
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *ent;
  char *__assertion;
  bool bVar4;
  FSoundID local_14;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003f69f8;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent != (AActor *)0x0) {
        pPVar3 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (ent->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar4) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar4 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f69f8;
        }
        goto LAB_003f69b5;
      }
    }
    else if (ent != (AActor *)0x0) goto LAB_003f69e8;
    ent = (AActor *)0x0;
LAB_003f69b5:
    if ((ent->ActiveSound).super_FSoundID.ID != 0) {
      S_Sound(ent,2,&local_14,1.0,1.0);
    }
    return 0;
  }
LAB_003f69e8:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003f69f8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc85,
                "int AF_AActor_A_ActiveSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ActiveSound)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->ActiveSound)
	{
		S_Sound(self, CHAN_VOICE, self->ActiveSound, 1, ATTN_NORM);
	}
	return 0;
}